

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O0

int izamax(int n,complex<double> *x,int incx)

{
  undefined4 in_register_0000003c;
  double dVar1;
  complex<double> z;
  complex<double> z_00;
  complex<double> z_01;
  complex<double> z_02;
  complex<double> z_03;
  complex<double> z_04;
  undefined4 local_34;
  double dStack_30;
  int value;
  double smax;
  undefined4 local_20;
  int ix;
  int i;
  int incx_local;
  complex<double> *x_local;
  int n_local;
  
  z._M_value._0_8_ = CONCAT44(in_register_0000003c,n);
  if ((n < 1) || (incx < 1)) {
    x_local._4_4_ = 0;
  }
  else {
    local_34 = 1;
    if (n == 1) {
      x_local._4_4_ = 1;
    }
    else {
      if (incx == 1) {
        z_02._M_value._8_8_ = x;
        z_02._M_value._0_8_ = z._M_value._0_8_;
        dStack_30 = zabs1(z_02);
        for (local_20 = 1; local_20 < n; local_20 = local_20 + 1) {
          z_03._M_value._8_8_ = x;
          z_03._M_value._0_8_ = z._M_value._0_8_;
          dVar1 = zabs1(z_03);
          if (dStack_30 < dVar1) {
            local_34 = local_20 + 1;
            z_04._M_value._8_8_ = x;
            z_04._M_value._0_8_ = z._M_value._0_8_;
            dStack_30 = zabs1(z_04);
          }
        }
      }
      else {
        z._M_value._8_8_ = x;
        dStack_30 = zabs1(z);
        for (local_20 = 1; local_20 < n; local_20 = local_20 + 1) {
          z_00._M_value._8_8_ = x;
          z_00._M_value._0_8_ = z._M_value._0_8_;
          dVar1 = zabs1(z_00);
          if (dStack_30 < dVar1) {
            local_34 = local_20 + 1;
            z_01._M_value._8_8_ = x;
            z_01._M_value._0_8_ = z._M_value._0_8_;
            dStack_30 = zabs1(z_01);
          }
        }
      }
      x_local._4_4_ = local_34;
    }
  }
  return x_local._4_4_;
}

Assistant:

int izamax ( int n, complex <double> x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    IZAMAX indexes the complex <double> vector element of maximum absolute value.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//    WARNING: This index is a 1-based index, not a 0-based index!
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for FORTRAN usage,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, pages 308-323, 1979.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, complex <double> X[], the vector.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Output, int IZAMAX, the index of the element of maximum
//    absolute value.
//
{
  int i;
  int ix;
  double smax;
  int value;

  value = 0;

  if ( n < 1 || incx  <=  0 )
  {
    return value;
  }

  value = 1;

  if ( n == 1 )
  {
    return value;
  }

  if ( incx != 1 )
  {
    ix = 0;
    smax = zabs1 ( x[0] );
    ix = ix + incx;

    for ( i = 1; i < n; i++ )
    {
      if ( smax < zabs1 ( x[ix] ) )
      {
        value = i + 1;
        smax = zabs1 ( x[ix] );
      }
      ix = ix + incx;
    }
  }
  else
  {
    smax = zabs1 ( x[0] );
    for ( i = 1; i < n; i++ )
    {
      if ( smax < zabs1 ( x[i] ) )
      {
        value = i + 1;
        smax = zabs1 ( x[i] );
      }
    }
  }

  return value;
}